

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  pointer puVar1;
  App *pAVar2;
  pointer pcVar3;
  pointer psVar4;
  App *pAVar5;
  ConfigBase *pCVar6;
  pointer ppAVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  ostream *poVar12;
  pointer pbVar13;
  long lVar14;
  pointer psVar15;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  _Var16;
  size_t sVar17;
  App *pAVar18;
  undefined8 *puVar19;
  long *plVar20;
  undefined7 in_register_00000009;
  char *pcVar21;
  long *plVar22;
  ulong *puVar23;
  size_type *psVar24;
  App **ppAVar25;
  size_type sVar26;
  pointer pbVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  undefined8 uVar30;
  _Alloc_hider _Var31;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *test_name;
  Option_p *opt;
  pointer puVar32;
  string *psVar33;
  bool bVar34;
  string single_name;
  string name;
  string value;
  string commentLead;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  string keyChars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  string commentTest;
  stringstream out;
  value_type local_448;
  string local_428;
  string local_408;
  string local_3e8;
  ConfigBase *local_3c8;
  uint local_3c0;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  string local_3b0;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string *local_350;
  string local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  App *local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_300;
  long *local_2f0;
  long local_2e8;
  long local_2e0 [3];
  string *local_2c8;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  string local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270 [3];
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  _Any_data local_218;
  code *local_208;
  undefined8 uStack_200;
  string local_1f8;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_3bc = (uint)CONCAT71(in_register_00000081,write_description);
  local_3b4 = (uint)CONCAT71(in_register_00000009,default_also);
  local_350 = prefix;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::push_back((char)&local_3b0);
  ::std::__cxx11::string::push_back((char)&local_3b0);
  local_2f0 = local_2e0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"#;","");
  ::std::__cxx11::string::push_back((char)&local_2f0);
  ::std::__cxx11::string::push_back((char)&local_2f0);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,local_2f0,local_2e8 + (long)local_2f0);
  local_2c8 = __return_storage_ptr__;
  ::std::__cxx11::string::push_back((char)&local_348);
  ::std::__cxx11::string::push_back((char)&local_348);
  ::std::__cxx11::string::push_back((char)&local_348);
  ::std::__cxx11::string::push_back((char)&local_348);
  ::std::__cxx11::string::push_back((char)&local_348);
  ::std::__cxx11::string::push_back((char)&local_348);
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar32 = (app->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (app->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar32 != puVar1) {
    do {
      _Var11 = ::std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (local_328.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          local_328.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (puVar32->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      if (_Var11._M_current ==
          local_328.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_328,
                    (value_type *)
                    (puVar32->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      }
      puVar32 = puVar32 + 1;
    } while (puVar32 != puVar1);
  }
  pbVar27 = local_328.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"OPTIONS","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&local_328,(const_iterator)pbVar27,&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_3c8 = this;
  local_308 = app;
  if (local_328.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_328.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_220 = local_328.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pbVar27 = local_328.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar28 = local_328.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar9 = 0;
    do {
      iVar10 = ::std::__cxx11::string::compare((char *)pbVar27);
      if (iVar10 == 0) {
        bVar8 = 1;
        if ((bVar9 & 1) == 0) goto LAB_00125d0e;
      }
      else {
        bVar34 = pbVar27->_M_string_length == 0;
        bVar8 = 1;
        if ((bVar34 & bVar9) == 0) {
          bVar8 = bVar34 | bVar9;
LAB_00125d0e:
          local_3c0 = CONCAT31(local_3c0._1_3_,bVar8);
          if ((((char)local_3bc != '\0') &&
              (iVar10 = ::std::__cxx11::string::compare((char *)pbVar27), iVar10 != 0)) &&
             (pbVar27->_M_string_length != 0)) {
            local_448._M_dataplus._M_p._0_1_ = 10;
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)&local_448,1);
            local_448._M_dataplus._M_p._0_1_ = this->commentChar;
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)&local_448,1);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(pbVar27->_M_dataplus)._M_p,pbVar27->_M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," Options\n",9);
          }
          local_218._M_unused._M_object = (void *)0x0;
          local_218._8_8_ = 0;
          local_208 = (code *)0x0;
          uStack_200 = 0;
          App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                           &local_370,app,(function<bool_(const_CLI::Option_*)> *)&local_218);
          if (local_208 != (code *)0x0) {
            (*local_208)(&local_218,&local_218,__destroy_functor);
          }
          local_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_370._M_string_length;
          _Var31._M_p = local_370._M_dataplus._M_p;
          if (local_370._M_dataplus._M_p != (pointer)local_370._M_string_length) {
            do {
              pAVar2 = *(App **)_Var31._M_p;
              if (((pAVar2->name_).field_2._M_local_buf[0xb] == '\x01') &&
                 (((pcVar3 = (pAVar2->name_)._M_dataplus._M_p,
                   pcVar3 == (pointer)pbVar27->_M_string_length &&
                   ((pcVar3 == (pointer)0x0 ||
                    (iVar10 = bcmp((((OptionBase<CLI::Option> *)&pAVar2->_vptr_App)->group_).
                                   _M_dataplus._M_p,(pbVar27->_M_dataplus)._M_p,(size_t)pcVar3),
                    iVar10 == 0)))) ||
                  ((iVar10 = ::std::__cxx11::string::compare((char *)pbVar27), iVar10 == 0 &&
                   ((pAVar2->name_)._M_dataplus._M_p == (pointer)0x0)))))) {
                pbVar13 = *(pointer *)((long)&(pAVar2->description_).field_2 + 8);
                if ((pbVar13 == *(pointer *)&pAVar2->allow_extras_) &&
                   (pbVar13 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&(pAVar2->description_)._M_dataplus)->_M_impl).
                              super__Vector_impl_data._M_start,
                   pbVar13 == (pointer)(pAVar2->description_)._M_string_length)) {
                  pbVar13 = (pointer)&(&pAVar2->parse_complete_callback_)
                                      [*(size_type *)
                                        &(pAVar2->final_callback_).super__Function_base._M_functor
                                       == 0]._M_invoker;
                }
                local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
                pcVar3 = (pbVar13->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_448,pcVar3,pcVar3 + pbVar13->_M_string_length);
                if (local_448._M_string_length == 0) {
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_448._M_dataplus._M_p != &local_448.field_2) goto LAB_00126397;
                }
                else {
                  Option::reduced_results_abi_cxx11_((results_t *)&local_388,(Option *)pAVar2);
                  detail::ini_join(&local_408,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_388,this->arraySeparator,this->arrayStart,
                                   this->arrayEnd,this->stringQuote,this->literalQuote);
                  bVar9 = (char *)local_408._M_string_length == (char *)0x0 & (byte)local_3b4;
                  local_3b8 = CONCAT31(local_3b8._1_3_,bVar9);
                  if (bVar9 == 1) {
                    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_428,
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&pAVar2->options_)[1]._M_allocated_capacity,
                               (pAVar2->usage_)._M_dataplus._M_p +
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&pAVar2->options_)[1]._M_allocated_capacity);
                    sVar26 = local_428._M_string_length;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p,
                                      local_428.field_2._M_allocated_capacity + 1);
                    }
                    if (sVar26 == 0) {
                      if (*(int *)&pAVar2->help_ptr_ == 0) {
                        pcVar21 = "false";
                      }
                      else {
                        pcVar21 = "\"\"";
                        if ((*(char *)((long)&(pAVar2->exclude_options_)._M_t._M_impl.
                                              super__Rb_tree_header._M_header._M_left + 3) == '\0')
                           && (pcVar21 = "\"\"", (pAVar2->name_).field_2._M_local_buf[8] != '\0')) {
                          pcVar21 = "\"<REQUIRED>\"";
                        }
                      }
                      ::std::__cxx11::string::_M_replace
                                ((ulong)&local_408,0,(char *)local_408._M_string_length,
                                 (ulong)pcVar21);
                      this = local_3c8;
                    }
                    else {
                      local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_3e8,
                                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)&pAVar2->options_)[1]._M_allocated_capacity,
                                 (pAVar2->usage_)._M_dataplus._M_p +
                                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)&pAVar2->options_)[1]._M_allocated_capacity);
                      detail::convert_arg_for_ini
                                (&local_428,&local_3e8,local_3c8->stringQuote,
                                 local_3c8->literalQuote,false);
                      ::std::__cxx11::string::operator=((string *)&local_408,(string *)&local_428);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p,
                                        local_428.field_2._M_allocated_capacity + 1);
                      }
                      this = local_3c8;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                        operator_delete(local_3e8._M_dataplus._M_p,
                                        local_3e8.field_2._M_allocated_capacity + 1);
                        this = local_3c8;
                      }
                    }
                  }
                  if ((char *)local_408._M_string_length != (char *)0x0) {
                    if (*(pointer *)
                         &(pAVar2->parse_complete_callback_).super__Function_base._M_functor !=
                        *(pointer *)
                         ((long)&(pAVar2->parse_complete_callback_).super__Function_base._M_functor
                         + 8)) {
                      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_240,local_408._M_dataplus._M_p,
                                 (char *)(local_408._M_string_length +
                                         (long)local_408._M_dataplus._M_p));
                      Option::get_flag_value(&local_428,(Option *)pAVar2,&local_448,&local_240);
                      ::std::__cxx11::string::operator=((string *)&local_408,(string *)&local_428);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p,
                                        local_428.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_240._M_dataplus._M_p != &local_240.field_2) {
                        operator_delete(local_240._M_dataplus._M_p,
                                        local_240.field_2._M_allocated_capacity + 1);
                      }
                    }
                    if (((char)local_3bc != '\0') &&
                       (lVar14._0_1_ = (pAVar2->option_defaults_).
                                       super_OptionBase<CLI::OptionDefaults>.required_,
                       lVar14._1_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.ignore_case_,
                       lVar14._2_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.ignore_underscore_,
                       lVar14._3_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.configurable_,
                       lVar14._4_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.disable_flag_override_,
                       lVar14._5_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.delimiter_,
                       lVar14._6_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.always_capture_default_,
                       lVar14._7_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.multi_option_policy_,
                       lVar14 != 0)) {
                      lVar14 = ::std::ostream::tellp();
                      if (lVar14 != 0) {
                        local_428._M_dataplus._M_p._0_1_ = 10;
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,(char *)&local_428,1);
                      }
                      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          (local_1a8,local_3b0._M_dataplus._M_p,
                                           local_3b0._M_string_length);
                      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                      lVar14 = *(long *)((long)&(pAVar2->option_defaults_).
                                                super_OptionBase<CLI::OptionDefaults>.group_.field_2
                                        + 8);
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_2a0,lVar14,
                                 *(long *)&(pAVar2->option_defaults_).
                                           super_OptionBase<CLI::OptionDefaults>.required_ + lVar14)
                      ;
                      detail::fix_newlines(&local_428,&local_3b0,&local_2a0);
                      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar12,local_428._M_dataplus._M_p,
                                           local_428._M_string_length);
                      local_3e8._M_dataplus._M_p._0_1_ = 10;
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)&local_3e8,1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p,
                                        local_428.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                        operator_delete(local_2a0._M_dataplus._M_p,
                                        local_2a0.field_2._M_allocated_capacity + 1);
                      }
                    }
                    clean_name_string(&local_448,&local_348);
                    ::std::operator+(&local_428,local_350,&local_448);
                    this = local_3c8;
                    if (((byte)local_3b8 & local_3c8->commentDefaultsBool) == 1) {
                      ::std::operator+(&local_3e8,local_3c8->commentChar,&local_428);
                      ::std::__cxx11::string::operator=((string *)&local_428,(string *)&local_3e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                        operator_delete(local_3e8._M_dataplus._M_p,
                                        local_3e8.field_2._M_allocated_capacity + 1);
                      }
                    }
                    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,local_428._M_dataplus._M_p,
                                         local_428._M_string_length);
                    local_3e8._M_dataplus._M_p._0_1_ = this->valueDelimiter;
                    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,(char *)&local_3e8,1);
                    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,local_408._M_dataplus._M_p,
                                         local_408._M_string_length);
                    local_3e8._M_dataplus._M_p._0_1_ = 10;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)&local_3e8,1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p,
                                      local_428.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_408._M_dataplus._M_p != &local_408.field_2) {
                    operator_delete(local_408._M_dataplus._M_p,
                                    local_408.field_2._M_allocated_capacity + 1);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_388);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_448._M_dataplus._M_p != &local_448.field_2) {
LAB_00126397:
                    operator_delete(local_448._M_dataplus._M_p,
                                    local_448.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              _Var31._M_p = _Var31._M_p + 8;
            } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var31._M_p != local_300);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_370._M_dataplus._M_p,
                            local_370.field_2._M_allocated_capacity -
                            (long)local_370._M_dataplus._M_p);
          }
          pbVar28 = local_220;
          app = local_308;
          bVar8 = (byte)local_3c0;
        }
      }
      pbVar27 = pbVar27 + 1;
      bVar9 = bVar8;
    } while (pbVar27 != pbVar28);
  }
  local_448.field_2._M_allocated_capacity = 0;
  local_448.field_2._8_8_ = 0;
  local_448._M_dataplus._M_p = (pointer)0x0;
  local_448._M_string_length = 0;
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
            (&local_388,
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_408);
  psVar4 = (app->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppAVar25 = local_388.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (psVar15 = (app->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar4; psVar15 = psVar15 + 1
      ) {
    *ppAVar25 = (psVar15->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppAVar25 = ppAVar25 + 1;
  }
  if ((code *)local_448.field_2._M_allocated_capacity != (code *)0x0) {
    _Var16 = ::std::
             __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                       ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                         )local_388.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                        (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                         )local_388.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish,
                        (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_LLNL[P]units_ThirdParty_CLI11_hpp:8793:39)>
                         )&local_448);
    if (_Var16._M_current !=
        local_388.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_388.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)_Var16;
    }
    if ((code *)local_448.field_2._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_448.field_2._M_allocated_capacity)(&local_448,&local_448,3);
    }
  }
  ppAVar7 = local_388.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_388.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_388.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_3b8 = local_3b4 & 0xff;
    local_3c0 = local_3bc & 0xff;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar2 = (App *)paVar29->_M_allocated_capacity;
      if (((pAVar2->name_)._M_string_length == 0) &&
         (((byte)local_3b4 != '\0' || (sVar17 = App::count_all(pAVar2), sVar17 != 0)))) {
        if (((char)local_3bc != '\0') && ((pAVar2->group_)._M_string_length != 0)) {
          local_448._M_dataplus._M_p._0_1_ = 10;
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_448,1);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(pAVar2->group_)._M_dataplus._M_p,
                               (pAVar2->group_)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," Options\n",9);
        }
        pcVar3 = (local_350->_M_dataplus)._M_p;
        local_1d8[0] = local_1c8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar3,pcVar3 + local_350->_M_string_length);
        (**(local_3c8->super_Config)._vptr_Config)
                  (&local_448,local_3c8,pAVar2,(ulong)local_3b8,(ulong)local_3c0,(string *)local_1d8
                  );
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_448._M_dataplus._M_p,local_448._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,
                          (ulong)(local_448.field_2._M_allocated_capacity + 1));
        }
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
      }
      paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar29->_M_local_buf + 8);
    } while (paVar29 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)ppAVar7);
    local_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    app = local_308;
    if (local_388.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_388.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      do {
        pAVar2 = (App *)paVar29->_M_allocated_capacity;
        sVar26 = (pAVar2->name_)._M_string_length;
        if (sVar26 != 0) {
          if ((byte)local_3b4 == '\0') {
            sVar17 = App::count_all(pAVar2);
            if (sVar17 == 0) goto LAB_00126b76;
            sVar26 = (pAVar2->name_)._M_string_length;
          }
          local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
          pcVar3 = (pAVar2->name_)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>((string *)&local_448,pcVar3,pcVar3 + sVar26);
          clean_name_string(&local_448,&local_348);
          if ((pAVar2->configurable_ == true) &&
             (((byte)local_3b4 != '\0' ||
              (pAVar18 = App::get_subcommand(app,pAVar2), pAVar18->parsed_ != 0)))) {
            if ((local_350->_M_string_length == 0) && (app->parent_ != (App *)0x0)) {
              pcVar3 = (app->name_)._M_dataplus._M_p;
              local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_408,pcVar3,pcVar3 + (app->name_)._M_string_length);
              clean_name_string(&local_408,&local_348);
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3e8,local_408._M_dataplus._M_p,
                         (char *)(local_408._M_string_length + (long)local_408._M_dataplus._M_p));
              ::std::__cxx11::string::_M_replace_aux
                        ((ulong)&local_3e8,local_3e8._M_string_length,0,'\x01');
              plVar20 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_3e8,(ulong)local_448._M_dataplus._M_p);
              puVar23 = (ulong *)(plVar20 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar20 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_428.field_2._M_allocated_capacity = *puVar23;
                local_428.field_2._8_8_ = plVar20[3];
                local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
              }
              else {
                local_428.field_2._M_allocated_capacity = *puVar23;
                local_428._M_dataplus._M_p = (pointer)*plVar20;
              }
              local_428._M_string_length = plVar20[1];
              *plVar20 = (long)puVar23;
              plVar20[1] = 0;
              *(undefined1 *)(plVar20 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)&local_448,(string *)&local_428);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_428._M_dataplus._M_p != &local_428.field_2) {
                operator_delete(local_428._M_dataplus._M_p,
                                local_428.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p,
                                local_3e8.field_2._M_allocated_capacity + 1);
              }
              pAVar18 = app->parent_;
              pAVar5 = pAVar18->parent_;
              while (pAVar5 != (App *)0x0) {
                local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                pcVar3 = (pAVar18->name_)._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_428,pcVar3,pcVar3 + (pAVar18->name_)._M_string_length);
                clean_name_string(&local_428,&local_348);
                local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_370,local_428._M_dataplus._M_p,
                           local_428._M_dataplus._M_p + local_428._M_string_length);
                ::std::__cxx11::string::_M_replace_aux
                          ((ulong)&local_370,local_370._M_string_length,0,'\x01');
                plVar20 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_370,(ulong)local_448._M_dataplus._M_p);
                puVar23 = (ulong *)(plVar20 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar20 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar23) {
                  local_3e8.field_2._M_allocated_capacity = *puVar23;
                  local_3e8.field_2._8_8_ = plVar20[3];
                  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                }
                else {
                  local_3e8.field_2._M_allocated_capacity = *puVar23;
                  local_3e8._M_dataplus._M_p = (pointer)*plVar20;
                }
                local_3e8._M_string_length = plVar20[1];
                *plVar20 = (long)puVar23;
                plVar20[1] = 0;
                *(undefined1 *)(plVar20 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)&local_448,(string *)&local_3e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                  operator_delete(local_3e8._M_dataplus._M_p,
                                  local_3e8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_370._M_dataplus._M_p != &local_370.field_2) {
                  operator_delete(local_370._M_dataplus._M_p,
                                  local_370.field_2._M_allocated_capacity + 1);
                }
                pAVar18 = pAVar18->parent_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_428._M_dataplus._M_p != &local_428.field_2) {
                  operator_delete(local_428._M_dataplus._M_p,
                                  local_428.field_2._M_allocated_capacity + 1);
                }
                pAVar5 = pAVar18->parent_;
              }
              local_428._M_dataplus._M_p._1_7_ =
                   (undefined7)((ulong)local_428._M_dataplus._M_p >> 8);
              local_428._M_dataplus._M_p._0_1_ = 0x5b;
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,(char *)&local_428,1);
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,local_448._M_dataplus._M_p,local_448._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]\n",2);
              app = local_308;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_dataplus._M_p != &local_408.field_2) {
                operator_delete(local_408._M_dataplus._M_p,
                                local_408.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              local_408._M_dataplus._M_p._0_1_ = 0x5b;
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,(char *)&local_408,1);
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(local_350->_M_dataplus)._M_p,local_350->_M_string_length
                                  );
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,local_448._M_dataplus._M_p,local_448._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]\n",2);
            }
            local_280[0] = local_270;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"");
            (**(local_3c8->super_Config)._vptr_Config)
                      (&local_408,local_3c8,pAVar2,(ulong)local_3b8,(ulong)local_3c0,
                       (string *)local_280);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_408._M_dataplus._M_p,local_408._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1
                             );
            }
            uVar30 = local_270[0]._M_allocated_capacity;
            _Var31._M_p = (pointer)local_280[0];
            if (local_280[0] != local_270) {
LAB_00126b52:
              operator_delete(_Var31._M_p,uVar30 + 1);
            }
          }
          else {
            ::std::operator+(&local_428,local_350,&local_448);
            plVar20 = (long *)::std::__cxx11::string::_M_replace_aux
                                        ((ulong)&local_428,local_428._M_string_length,0,'\x01');
            local_2c0 = &local_2b0;
            plVar22 = plVar20 + 2;
            if ((long *)*plVar20 == plVar22) {
              local_2b0 = *plVar22;
              uStack_2a8 = (undefined4)plVar20[3];
              uStack_2a4 = *(undefined4 *)((long)plVar20 + 0x1c);
            }
            else {
              local_2b0 = *plVar22;
              local_2c0 = (long *)*plVar20;
            }
            local_2b8 = plVar20[1];
            *plVar20 = (long)plVar22;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            (**(local_3c8->super_Config)._vptr_Config)
                      (&local_408,local_3c8,pAVar2,(ulong)local_3b8,(ulong)local_3c0,&local_2c0);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_408._M_dataplus._M_p,local_408._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2c0 != &local_2b0) {
              operator_delete(local_2c0,local_2b0 + 1);
            }
            uVar30 = local_428.field_2._M_allocated_capacity;
            _Var31._M_p = local_428._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._M_dataplus._M_p != &local_428.field_2) goto LAB_00126b52;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_dataplus._M_p != &local_448.field_2) {
            operator_delete(local_448._M_dataplus._M_p,
                            (ulong)(local_448.field_2._M_allocated_capacity + 1));
          }
        }
LAB_00126b76:
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar29->_M_local_buf + 8);
      } while (paVar29 != local_300);
    }
  }
  pCVar6 = local_3c8;
  if ((char)local_3bc != '\0') {
    ::std::__cxx11::stringbuf::str();
    sVar26 = local_448._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,
                      (ulong)(local_448.field_2._M_allocated_capacity + 1));
    }
    if (sVar26 != 0) {
      ::std::operator+(&local_428,pCVar6->commentChar,&local_3b0);
      ::std::operator+(&local_370,pCVar6->commentChar,&local_3b0);
      pcVar3 = (app->description_)._M_dataplus._M_p;
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,pcVar3,pcVar3 + (app->description_)._M_string_length);
      detail::fix_newlines(&local_3e8,&local_370,&local_1f8);
      uVar30 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        uVar30 = local_428.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar30 < local_3e8._M_string_length + local_428._M_string_length) {
        uVar30 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          uVar30 = local_3e8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar30 < local_3e8._M_string_length + local_428._M_string_length)
        goto LAB_00126fc3;
        puVar19 = (undefined8 *)
                  ::std::__cxx11::string::replace
                            ((ulong)&local_3e8,0,(char *)0x0,(ulong)local_428._M_dataplus._M_p);
      }
      else {
LAB_00126fc3:
        puVar19 = (undefined8 *)
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_428,(ulong)local_3e8._M_dataplus._M_p);
      }
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      psVar24 = puVar19 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar24) {
        local_408.field_2._M_allocated_capacity = *psVar24;
        local_408.field_2._8_8_ = puVar19[3];
      }
      else {
        local_408.field_2._M_allocated_capacity = *psVar24;
        local_408._M_dataplus._M_p = (pointer)*puVar19;
      }
      local_408._M_string_length = puVar19[1];
      *puVar19 = psVar24;
      puVar19[1] = 0;
      *(undefined1 *)psVar24 = 0;
      plVar20 = (long *)::std::__cxx11::string::_M_replace_aux
                                  ((ulong)&local_408,local_408._M_string_length,0,'\x01');
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      plVar22 = plVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar22) {
        local_448.field_2._M_allocated_capacity = *plVar22;
        local_448.field_2._8_8_ = plVar20[3];
      }
      else {
        local_448.field_2._M_allocated_capacity = *plVar22;
        local_448._M_dataplus._M_p = (pointer)*plVar20;
      }
      local_448._M_string_length = plVar20[1];
      *plVar20 = (long)plVar22;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      psVar33 = local_2c8;
      plVar20 = (long *)::std::__cxx11::string::replace
                                  ((ulong)&local_408,0,(char *)0x0,(ulong)local_448._M_dataplus._M_p
                                  );
      (psVar33->_M_dataplus)._M_p = (pointer)&psVar33->field_2;
      psVar24 = (size_type *)(plVar20 + 2);
      if ((size_type *)*plVar20 == psVar24) {
        lVar14 = plVar20[3];
        (psVar33->field_2)._M_allocated_capacity = *psVar24;
        *(long *)((long)&psVar33->field_2 + 8) = lVar14;
      }
      else {
        (psVar33->_M_dataplus)._M_p = (pointer)*plVar20;
        (psVar33->field_2)._M_allocated_capacity = *psVar24;
      }
      psVar33->_M_string_length = plVar20[1];
      *plVar20 = (long)psVar24;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,
                        (ulong)(local_448.field_2._M_allocated_capacity + 1));
      }
      goto LAB_001271e3;
    }
  }
  psVar33 = local_2c8;
  ::std::__cxx11::stringbuf::str();
LAB_001271e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_388.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_388.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_388.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,local_2e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    CONCAT71(local_3b0.field_2._M_allocated_capacity._1_7_,
                             local_3b0.field_2._M_local_buf[0]) + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar33;
}

Assistant:

CLI11_INLINE std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::string commentTest = "#;";
    commentTest.push_back(commentChar);
    commentTest.push_back(parentSeparatorChar);

    std::string keyChars = commentTest;
    keyChars.push_back(literalQuote);
    keyChars.push_back(stringQuote);
    keyChars.push_back(arrayStart);
    keyChars.push_back(arrayEnd);
    keyChars.push_back(valueDelimiter);
    keyChars.push_back(arraySeparator);

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("OPTIONS"));

    for(auto &group : groups) {
        if(group == "OPTIONS" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "OPTIONS" && !group.empty()) {
            out << '\n' << commentChar << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {
            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "OPTIONS" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string single_name = opt->get_single_name();
                if(single_name.empty()) {
                    continue;
                }

                auto results = opt->reduced_results();
                std::string value =
                    detail::ini_join(results, arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);

                bool isDefault = false;
                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str(), stringQuote, literalQuote, false);
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    } else if(opt->get_run_callback_for_default() || !opt->get_required()) {
                        value = "\"\"";  // empty string default value
                    } else {
                        value = "\"<REQUIRED>\"";
                    }
                    isDefault = true;
                }

                if(!value.empty()) {
                    if(!opt->get_fnames().empty()) {
                        try {
                            value = opt->get_flag_value(single_name, value);
                        } catch(const CLI::ArgumentMismatch &) {
                            bool valid{false};
                            for(const auto &test_name : opt->get_fnames()) {
                                try {
                                    value = opt->get_flag_value(test_name, value);
                                    single_name = test_name;
                                    valid = true;
                                } catch(const CLI::ArgumentMismatch &) {
                                    continue;
                                }
                            }
                            if(!valid) {
                                value = detail::ini_join(
                                    opt->results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                            }
                        }
                    }
                    if(write_description && opt->has_description()) {
                        if(out.tellp() != std::streampos(0)) {
                            out << '\n';
                        }
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    clean_name_string(single_name, keyChars);

                    std::string name = prefix + single_name;
                    if(commentDefaultsBool && isDefault) {
                        name = commentChar + name;
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }

    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            /*if (!prefix.empty() || app->get_parent() == nullptr) {
                out << '[' << prefix << "___"<< subcom->get_group() << "]\n";
            } else {
                std::string subname = app->get_name() + parentSeparatorChar + "___"+subcom->get_group();
                const auto *p = app->get_parent();
                while(p->get_parent() != nullptr) {
                    subname = p->get_name() + parentSeparatorChar +subname;
                    p = p->get_parent();
                }
                out << '[' << subname << "]\n";
            }
            */
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            std::string subname = subcom->get_name();
            clean_name_string(subname, keyChars);

            if(subcom->get_configurable() && (default_also || app->got_subcommand(subcom))) {
                if(!prefix.empty() || app->get_parent() == nullptr) {

                    out << '[' << prefix << subname << "]\n";
                } else {
                    std::string appname = app->get_name();
                    clean_name_string(appname, keyChars);
                    subname = appname + parentSeparatorChar + subname;
                    const auto *p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        std::string pname = p->get_name();
                        clean_name_string(pname, keyChars);
                        subname = pname + parentSeparatorChar + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subname + parentSeparatorChar);
            }
        }
    }

    if(write_description && !out.str().empty()) {
        std::string outString =
            commentChar + commentLead + detail::fix_newlines(commentChar + commentLead, app->get_description()) + '\n';
        return outString + out.str();
    }
    return out.str();
}